

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_matchers_impl.hpp
# Opt level: O0

void __thiscall
Catch::MatchExpr<const_double_&,_IntegratorXX::Matchers::WithinAbsMatcher>::
streamReconstructedExpression
          (MatchExpr<const_double_&,_IntegratorXX::Matchers::WithinAbsMatcher> *this,ostream *os)

{
  ostream *poVar1;
  string local_68;
  string local_38;
  ostream *local_18;
  ostream *os_local;
  MatchExpr<const_double_&,_IntegratorXX::Matchers::WithinAbsMatcher> *this_local;
  
  local_18 = os;
  os_local = (ostream *)this;
  Detail::stringify<double>(&local_38,this->m_arg);
  poVar1 = std::operator<<(os,(string *)&local_38);
  poVar1 = std::operator<<(poVar1,' ');
  Matchers::MatcherUntypedBase::toString_abi_cxx11_(&local_68,(MatcherUntypedBase *)this->m_matcher)
  ;
  std::operator<<(poVar1,(string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream& os ) const override {
            os << Catch::Detail::stringify( m_arg )
               << ' '
               << m_matcher.toString();
        }